

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__calculate_sample_range_downsample
               (int n,float in_pixels_radius,float scale_ratio,float out_shift,int *out_first_pixel,
               int *out_last_pixel,float *out_center_of_in)

{
  float fVar1;
  double dVar2;
  float out_pixel_influence_upperbound;
  float out_pixel_influence_lowerbound;
  float in_pixel_influence_upperbound;
  float in_pixel_influence_lowerbound;
  float in_pixel_center;
  float *out_center_of_in_local;
  int *out_last_pixel_local;
  int *out_first_pixel_local;
  float out_shift_local;
  float scale_ratio_local;
  float in_pixels_radius_local;
  int n_local;
  
  fVar1 = (float)n + 0.5;
  *out_center_of_in = fVar1 * scale_ratio + -out_shift;
  dVar2 = floor((double)((fVar1 - in_pixels_radius) * scale_ratio + -out_shift) + 0.5);
  *out_first_pixel = (int)dVar2;
  dVar2 = floor((double)((fVar1 + in_pixels_radius) * scale_ratio + -out_shift) - 0.5);
  *out_last_pixel = (int)dVar2;
  return;
}

Assistant:

static void stbir__calculate_sample_range_downsample(int n, float in_pixels_radius, float scale_ratio, float out_shift, int* out_first_pixel, int* out_last_pixel, float* out_center_of_in)
{
    float in_pixel_center = (float)n + 0.5f;
    float in_pixel_influence_lowerbound = in_pixel_center - in_pixels_radius;
    float in_pixel_influence_upperbound = in_pixel_center + in_pixels_radius;

    float out_pixel_influence_lowerbound = in_pixel_influence_lowerbound * scale_ratio - out_shift;
    float out_pixel_influence_upperbound = in_pixel_influence_upperbound * scale_ratio - out_shift;

    *out_center_of_in = in_pixel_center * scale_ratio - out_shift;
    *out_first_pixel = (int)(floor(out_pixel_influence_lowerbound + 0.5));
    *out_last_pixel = (int)(floor(out_pixel_influence_upperbound - 0.5));
}